

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pocman.cpp
# Opt level: O0

void __thiscall
despot::Pocman::MoveGhostAggressive(Pocman *this,PocmanState *pocstate,int g,Random *random)

{
  undefined8 uVar1;
  int iVar2;
  int iVar3;
  reference pvVar4;
  long lVar5;
  reference pvVar6;
  double dVar7;
  int local_58;
  Coord newpos;
  int local_3c;
  int dist;
  int dir;
  int bestDir;
  Coord bestPos;
  int bestDist;
  Random *random_local;
  int g_local;
  PocmanState *pocstate_local;
  Pocman *this_local;
  
  dVar7 = (double)despot::Random::NextDouble();
  if (dVar7 < this->chase_prob_ || dVar7 == this->chase_prob_) {
    _bestPos = Grid<int>::xsize(&this->maze_);
    iVar2 = Grid<int>::ysize(&this->maze_);
    _bestPos = _bestPos + iVar2;
    pvVar4 = std::vector<despot::Coord,_std::allocator<despot::Coord>_>::operator[]
                       (&pocstate->ghost_pos,(long)g);
    _dir = *(long *)pvVar4;
    for (local_3c = 0; local_3c < 4; local_3c = local_3c + 1) {
      uVar1 = *(undefined8 *)&pocstate->pocman_pos;
      pvVar4 = std::vector<despot::Coord,_std::allocator<despot::Coord>_>::operator[]
                         (&pocstate->ghost_pos,(long)g);
      iVar2 = despot::Coord::DirectionalDistance(uVar1,*(undefined8 *)pvVar4,local_3c);
      pvVar4 = std::vector<despot::Coord,_std::allocator<despot::Coord>_>::operator[]
                         (&pocstate->ghost_pos,(long)g);
      lVar5 = NextPos(this,pvVar4,local_3c);
      if (((iVar2 <= _bestPos) && (local_58 = (int)lVar5, -1 < local_58)) && (-1 < lVar5)) {
        iVar3 = despot::Compass::Opposite(local_3c);
        pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&pocstate->ghost_dir,(long)g);
        if (iVar3 != *pvVar6) {
          _dir = lVar5;
          _bestPos = iVar2;
        }
      }
    }
    pvVar4 = std::vector<despot::Coord,_std::allocator<despot::Coord>_>::operator[]
                       (&pocstate->ghost_pos,(long)g);
    *(long *)pvVar4 = _dir;
    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&pocstate->ghost_dir,(long)g);
    *pvVar6 = -1;
  }
  else {
    MoveGhostRandom(this,pocstate,g,random);
  }
  return;
}

Assistant:

void Pocman::MoveGhostAggressive(PocmanState& pocstate, int g,
	Random &random) const {
	if (random.NextDouble() > chase_prob_) {
		MoveGhostRandom(pocstate, g, random);
		return;
	}

	int bestDist = maze_.xsize() + maze_.ysize();
	Coord bestPos = pocstate.ghost_pos[g];
	int bestDir = -1;
	for (int dir = 0; dir < 4; dir++) {
		int dist = Coord::DirectionalDistance(pocstate.pocman_pos,
			pocstate.ghost_pos[g], dir);
		Coord newpos = NextPos(pocstate.ghost_pos[g], dir);
		if (dist <= bestDist && newpos.x >= 0 && newpos.y >= 0
			&& Compass::Opposite(dir) != pocstate.ghost_dir[g]) {
			bestDist = dist;
			bestPos = newpos;
		}
	}

	pocstate.ghost_pos[g] = bestPos;
	pocstate.ghost_dir[g] = bestDir;
}